

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

void __thiscall
DnsStats::RegisterOptionsByIp(DnsStats *this,uint8_t *source_addr,size_t source_addr_length)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t *puVar5;
  int iVar6;
  bool bVar7;
  StatsByIP *this_00;
  ulong uVar8;
  bool stored;
  StatsByIP x;
  bool local_e9;
  DnsHashEntry local_e8;
  StatsByIP local_88;
  
  StatsByIP::StatsByIP(&local_88,source_addr,source_addr_length,false,false,false,false);
  this_00 = BinHash<StatsByIP>::Retrieve(&this->statsByIp,&local_88);
  if (this_00 == (StatsByIP *)0x0) {
    if (this->max_stats_by_ip_count <= (this->statsByIp).tableCount) goto LAB_0018f516;
    local_e8.HashNext = (DnsHashEntry *)((ulong)local_e8.HashNext & 0xffffffffffffff00);
    this_00 = BinHash<StatsByIP>::InsertOrAdd(&this->statsByIp,&local_88,true,(bool *)&local_e8);
    if (this_00 == (StatsByIP *)0x0) goto LAB_0018f516;
LAB_0018f43f:
    this_00->query_seen = true;
  }
  else if (this_00->query_seen == false) {
    this_00->count = this_00->count + 1;
    goto LAB_0018f43f;
  }
  if (((this->is_using_edns == true) && (this->edns_options != (uint8_t *)0x0)) &&
     (3 < this->edns_options_length)) {
    uVar8 = 0;
    do {
      puVar5 = this->edns_options;
      uVar1 = puVar5[uVar8];
      iVar6 = (int)uVar8;
      uVar2 = puVar5[iVar6 + 1];
      uVar3 = puVar5[iVar6 + 2];
      uVar4 = puVar5[iVar6 + 3];
      bVar7 = StatsByIP::RegisterNewOption(this_00,CONCAT11(uVar1,uVar2));
      if (bVar7) {
        local_e8.HashNext = (DnsHashEntry *)0x0;
        local_e9 = false;
        local_e8.count = 1;
        local_e8.hash = 0;
        local_e8.registry_id = 0x2d;
        local_e8.key_type = 0;
        local_e8.key_length = 4;
        local_e8.field_6.key_number = (uint)CONCAT11(uVar1,uVar2);
        BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,&local_e8,true,&local_e9);
      }
      uVar8 = (ulong)((uint)CONCAT11(uVar3,uVar4) + iVar6 + 4);
    } while ((uint)CONCAT11(uVar3,uVar4) + iVar6 + 8 <= this->edns_options_length);
  }
LAB_0018f516:
  StatsByIP::~StatsByIP(&local_88);
  return;
}

Assistant:

void DnsStats::RegisterOptionsByIp(const uint8_t * source_addr, size_t source_addr_length)
{
    StatsByIP x(source_addr, source_addr_length, false, false, false, false);
    StatsByIP * y = statsByIp.Retrieve(&x);

    if (y == NULL) {
        if (statsByIp.GetCount() < max_stats_by_ip_count) {
            bool stored = false;

            if ((y = statsByIp.InsertOrAdd(&x, true, &stored)) != NULL) {
                y->query_seen = true;
            }
        }
    } else {
        if (!y->query_seen) {
            y->count++;
            y->query_seen = true;
        }
    }

    if (y != NULL && is_using_edns && edns_options != NULL) {
        /* Should export the EDNS Options to new table. */
        uint32_t current_index = 0;
        while (current_index + 4 <= edns_options_length)
        {
            uint16_t o_code = (edns_options[current_index] << 8) | edns_options[current_index + 1];
            uint16_t o_length = (edns_options[current_index + 2] << 8) | edns_options[current_index + 3];
            bool should_export = y->RegisterNewOption(o_code);

            if (should_export) {
                SubmitRegistryNumber(REGISTRY_EDNS_OPT_USAGE, o_code);
            }
            current_index += 4 + o_length;
        }
    }
}